

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O0

void tinyformat::detail::formatImpl(ostream *out,char *fmt,FormatArg *formatters,int numFormatters)

{
  FormatArg *fmtEnd_00;
  FormatArg *this;
  ulong uVar1;
  char *pcVar2;
  undefined1 *puVar3;
  size_t iend;
  size_t i;
  string result;
  undefined1 local_1d8 [8];
  ostringstream tmpStream;
  FormatArg *arg;
  char *fmtEnd;
  bool local_45;
  int ntrunc;
  bool spacePadPositive;
  int argIndex;
  char origFill;
  streamsize sStack_38;
  fmtflags origFlags;
  streamsize origPrecision;
  streamsize origWidth;
  FormatArg *pFStack_20;
  int numFormatters_local;
  FormatArg *formatters_local;
  char *fmt_local;
  ostream *out_local;
  
  origWidth._4_4_ = numFormatters;
  pFStack_20 = formatters;
  formatters_local = (FormatArg *)fmt;
  fmt_local = (char *)out;
  origPrecision =
       std::ios_base::width
                 ((ios_base *)((long)&out->_vptr_basic_ostream + (long)out->_vptr_basic_ostream[-3])
                 );
  sStack_38 = std::ios_base::precision
                        ((ios_base *)(fmt_local + *(long *)(*(long *)fmt_local + -0x18)));
  argIndex = std::ios_base::flags((ios_base *)(fmt_local + *(long *)(*(long *)fmt_local + -0x18)));
  spacePadPositive = (bool)std::ios::fill();
  ntrunc = 0;
  while( true ) {
    if (origWidth._4_4_ <= ntrunc) {
      formatters_local =
           (FormatArg *)printFormatStringLiteral((ostream *)fmt_local,(char *)formatters_local);
      if (*(char *)&formatters_local->m_value != '\0') {
        __assert_fail("0 && \"tinyformat: Too many conversion specifiers in format string\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/Kingcom[P]armips/ext/tinyformat/tinyformat.h"
                      ,0x342,
                      "void tinyformat::detail::formatImpl(std::ostream &, const char *, const detail::FormatArg *, int)"
                     );
      }
      std::ios_base::width
                ((ios_base *)(fmt_local + *(long *)(*(long *)fmt_local + -0x18)),origPrecision);
      std::ios_base::precision
                ((ios_base *)(fmt_local + *(long *)(*(long *)fmt_local + -0x18)),sStack_38);
      std::ios_base::flags((ios_base *)(fmt_local + *(long *)(*(long *)fmt_local + -0x18)),argIndex)
      ;
      std::ios::fill((char)fmt_local + (char)*(undefined8 *)(*(long *)fmt_local + -0x18));
      return;
    }
    formatters_local =
         (FormatArg *)printFormatStringLiteral((ostream *)fmt_local,(char *)formatters_local);
    local_45 = false;
    fmtEnd._4_4_ = -1;
    fmtEnd_00 = (FormatArg *)
                streamStateFromFormat
                          ((ostream *)fmt_local,&local_45,(int *)((long)&fmtEnd + 4),
                           (char *)formatters_local,pFStack_20,&ntrunc,origWidth._4_4_);
    if (origWidth._4_4_ <= ntrunc) break;
    this = pFStack_20 + ntrunc;
    if ((local_45 & 1U) == 0) {
      FormatArg::format(this,(ostream *)fmt_local,(char *)formatters_local,(char *)fmtEnd_00,
                        fmtEnd._4_4_);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
      std::ios::copyfmt((ios *)(local_1d8 + (long)*(_func_int **)((long)local_1d8 + -0x18)));
      std::ios_base::setf((ios_base *)(local_1d8 + (long)*(_func_int **)((long)local_1d8 + -0x18)),
                          _S_showpos);
      FormatArg::format(this,(ostream *)local_1d8,(char *)formatters_local,(char *)fmtEnd_00,
                        fmtEnd._4_4_);
      std::__cxx11::ostringstream::str();
      iend = 0;
      uVar1 = std::__cxx11::string::size();
      for (; iend < uVar1; iend = iend + 1) {
        pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)&i);
        if (*pcVar2 == '+') {
          puVar3 = (undefined1 *)std::__cxx11::string::operator[]((ulong)&i);
          *puVar3 = 0x20;
        }
      }
      std::operator<<((ostream *)fmt_local,(string *)&i);
      std::__cxx11::string::~string((string *)&i);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
    }
    ntrunc = ntrunc + 1;
    formatters_local = fmtEnd_00;
  }
  __assert_fail("0 && \"tinyformat: Not enough format arguments\"",
                "/workspace/llm4binary/github/license_c_cmakelists/Kingcom[P]armips/ext/tinyformat/tinyformat.h"
                ,0x326,
                "void tinyformat::detail::formatImpl(std::ostream &, const char *, const detail::FormatArg *, int)"
               );
}

Assistant:

inline void formatImpl(std::ostream& out, const char* fmt,
                       const detail::FormatArg* formatters,
                       int numFormatters)
{
    // Saved stream state
    std::streamsize origWidth = out.width();
    std::streamsize origPrecision = out.precision();
    std::ios::fmtflags origFlags = out.flags();
    char origFill = out.fill();

    for (int argIndex = 0; argIndex < numFormatters; ++argIndex)
    {
        // Parse the format string
        fmt = printFormatStringLiteral(out, fmt);
        bool spacePadPositive = false;
        int ntrunc = -1;
        const char* fmtEnd = streamStateFromFormat(out, spacePadPositive, ntrunc, fmt,
                                                   formatters, argIndex, numFormatters);
        if (argIndex >= numFormatters)
        {
            // Check args remain after reading any variable width/precision
            TINYFORMAT_ERROR("tinyformat: Not enough format arguments");
            return;
        }
        const FormatArg& arg = formatters[argIndex];
        // Format the arg into the stream.
        if(!spacePadPositive)
            arg.format(out, fmt, fmtEnd, ntrunc);
        else
        {
            // The following is a special case with no direct correspondence
            // between stream formatting and the printf() behaviour.  Simulate
            // it crudely by formatting into a temporary string stream and
            // munging the resulting string.
            std::ostringstream tmpStream;
            tmpStream.copyfmt(out);
            tmpStream.setf(std::ios::showpos);
            arg.format(tmpStream, fmt, fmtEnd, ntrunc);
            std::string result = tmpStream.str(); // allocates... yuck.
            for(size_t i = 0, iend = result.size(); i < iend; ++i)
                if(result[i] == '+') result[i] = ' ';
            out << result;
        }
        fmt = fmtEnd;
    }

    // Print remaining part of format string.
    fmt = printFormatStringLiteral(out, fmt);
    if(*fmt != '\0')
        TINYFORMAT_ERROR("tinyformat: Too many conversion specifiers in format string");

    // Restore stream state
    out.width(origWidth);
    out.precision(origPrecision);
    out.flags(origFlags);
    out.fill(origFill);
}